

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::Initialize
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZGeoEl *refel)

{
  char cVar1;
  int iVar2;
  int col;
  uint uVar3;
  TPZGeoElSide NeighSide;
  TPZGeoElSide NextSide;
  TPZGeoElSide ElemSide;
  TPZGeoElSide local_1e8;
  TPZTransform<double> NeighTransf;
  
  this->fGeoEl = refel;
  uVar3 = 5;
  do {
    if (uVar3 == 0x13) {
      return;
    }
    iVar2 = (**(code **)(*(long *)refel + 0x140))(refel,uVar3);
    if (iVar2 == 0) {
      ElemSide.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      ElemSide.fGeoEl = refel;
      ElemSide.fSide = uVar3;
      TPZGeoElSide::Neighbour(&NextSide,&ElemSide);
      if (NextSide.fGeoEl != (TPZGeoEl *)0x0) {
        while (NextSide.fGeoEl != ElemSide.fGeoEl) {
          if ((NextSide.fGeoEl != (TPZGeoEl *)0x0) && (-1 < NextSide.fSide)) {
            cVar1 = (**(code **)(*(long *)NextSide.fGeoEl + 0xd0))();
            if (cVar1 == '\0') {
              cVar1 = (**(code **)(*(long *)NextSide.fGeoEl + 0xe0))();
              if (cVar1 == '\0') {
                NeighSide.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_0172da80;
                NeighSide.fSide = NextSide.fSide;
                NeighSide.fGeoEl = NextSide.fGeoEl;
                iVar2 = TPZGeoElSide::Dimension(&NeighSide);
                col = TPZGeoElSide::Dimension(&NeighSide);
                TPZTransform<double>::TPZTransform(&NeighTransf,iVar2,col);
                local_1e8.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_0172da80;
                local_1e8.fSide = NeighSide.fSide;
                local_1e8.fGeoEl = NeighSide.fGeoEl;
                TPZGeoElSide::SideTransform3(&ElemSide,&local_1e8,&NeighTransf);
                (*(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.
                  super_TPZPyramid.super_TPZSavable._vptr_TPZSavable[9])
                          (this,(ulong)uVar3,&NeighSide,&NeighTransf);
                TPZTransform<double>::~TPZTransform(&NeighTransf);
                break;
              }
            }
          }
          TPZGeoElSide::Neighbour((TPZGeoElSide *)&NeighTransf,&NextSide);
          NextSide.fSide =
               (int)NeighTransf.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
          NextSide.fGeoEl = (TPZGeoEl *)NeighTransf._8_8_;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Initialize(TPZGeoEl *refel)
{
    fGeoEl = refel;
    for(int byside = TGeo::NNodes; byside < (TGeo::NSides); byside++)
    {
        if (refel->SideIsUndefined(byside)) {
            continue;
        }
        TPZGeoElSide ElemSide(refel,byside);
        TPZGeoElSide NextSide(ElemSide.Neighbour());
        if(!NextSide.Element()) continue;
        while(NextSide.Element() != ElemSide.Element())
        {
            if(NextSide.Exists() && !NextSide.Element()->IsLinearMapping() && !NextSide.Element()->IsGeoBlendEl())
            {
                TPZGeoElSide NeighSide = NextSide;
                TPZTransform<> NeighTransf(NeighSide.Dimension(),NeighSide.Dimension());
                ElemSide.SideTransform3(NeighSide,NeighTransf);
                SetNeighbourInfo(byside,NeighSide,NeighTransf);
                break;
            }
            NextSide = NextSide.Neighbour();
        }
    }
}